

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStep_Resize(ARKodeMem ark_mem,N_Vector y0,sunrealtype hscale,sunrealtype t0,
                  ARKVecResizeFn resize,void *resize_data)

{
  int iVar1;
  void *resize_data_00;
  ARKodeMem pAVar2;
  sunindextype in_RCX;
  long *in_RDX;
  long in_RSI;
  ARKodeMem in_RDI;
  int retval;
  sunindextype liw_diff;
  sunindextype lrw_diff;
  sunindextype liw1;
  sunindextype lrw1;
  SUNNonlinearSolver NLS;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem *in_stack_ffffffffffffff78;
  long *plVar3;
  ARKodeMem in_stack_ffffffffffffff80;
  ARKodeMem lrw_diff_00;
  ARKodeMem in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  ARKVecResizeFn resize_00;
  N_Vector *v;
  MRIStepInnerStepper in_stack_ffffffffffffffb8;
  long *in_stack_ffffffffffffffc0;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                       in_stack_ffffffffffffff78);
  if (local_4 == 0) {
    resize_00 = (ARKVecResizeFn)0x0;
    v = (N_Vector *)0x0;
    if (*(long *)(*(long *)(in_RSI + 8) + 0x20) != 0) {
      N_VSpace(in_RSI,&stack0xffffffffffffffb0,&stack0xffffffffffffffa8);
    }
    resize_data_00 = (void *)((long)v - in_RDI->lrw1);
    pAVar2 = (ARKodeMem)(resize_00 + -in_RDI->liw1);
    in_RDI->lrw1 = (sunindextype)v;
    in_RDI->liw1 = (sunindextype)resize_00;
    lrw_diff_00 = pAVar2;
    if (in_stack_ffffffffffffffc0[5] != 0) {
      plVar3 = &in_RDI->lrw;
      in_stack_ffffffffffffff88 = (ARKodeMem)&in_RDI->liw;
      iVar1 = arkResizeVecArray(resize_00,resize_data_00,(int)((ulong)pAVar2 >> 0x20),
                                (N_Vector)CONCAT44(local_4,in_stack_ffffffffffffff90),
                                (N_Vector **)in_stack_ffffffffffffff88,(sunindextype)pAVar2,
                                in_stack_ffffffffffffffc0,in_RCX,in_RDX);
      if (iVar1 == 0) {
        arkProcessError(in_RDI,-0x14,0x1a3,"mriStep_Resize",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                        ,"Unable to resize vector",plVar3);
        return -0x14;
      }
      in_stack_ffffffffffffff80 = pAVar2;
      if ((int)in_stack_ffffffffffffffc0[7] != 0) {
        in_stack_ffffffffffffffc0[6] = in_stack_ffffffffffffffc0[5];
      }
    }
    pAVar2 = lrw_diff_00;
    if ((in_stack_ffffffffffffffc0[6] != 0) && ((int)in_stack_ffffffffffffffc0[7] == 0)) {
      plVar3 = &in_RDI->lrw;
      in_stack_ffffffffffffff88 = (ARKodeMem)&in_RDI->liw;
      iVar1 = arkResizeVecArray(resize_00,resize_data_00,(int)((ulong)lrw_diff_00 >> 0x20),
                                (N_Vector)CONCAT44(local_4,in_stack_ffffffffffffff90),
                                (N_Vector **)in_stack_ffffffffffffff88,(sunindextype)lrw_diff_00,
                                in_stack_ffffffffffffffc0,in_RCX,in_RDX);
      in_stack_ffffffffffffff80 = lrw_diff_00;
      if (iVar1 == 0) {
        arkProcessError(in_RDI,-0x14,0x1b1,"mriStep_Resize",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                        ,"Unable to resize vector",plVar3);
        return -0x14;
      }
    }
    if ((in_stack_ffffffffffffffc0[0x11] == 0) ||
       (iVar1 = arkResizeVec(pAVar2,(ARKVecResizeFn)CONCAT44(local_4,in_stack_ffffffffffffff90),
                             in_stack_ffffffffffffff88,(sunindextype)in_stack_ffffffffffffff80,
                             (sunindextype)(in_stack_ffffffffffffffc0 + 0x11),(N_Vector)0x187665,v),
       iVar1 != 0)) {
      if ((in_stack_ffffffffffffffc0[0x12] == 0) ||
         (iVar1 = arkResizeVec(pAVar2,(ARKVecResizeFn)CONCAT44(local_4,in_stack_ffffffffffffff90),
                               in_stack_ffffffffffffff88,(sunindextype)in_stack_ffffffffffffff80,
                               (sunindextype)(in_stack_ffffffffffffffc0 + 0x12),(N_Vector)0x1876e8,v
                              ), iVar1 != 0)) {
        if ((in_stack_ffffffffffffffc0[0x13] == 0) ||
           (iVar1 = arkResizeVec(pAVar2,(ARKVecResizeFn)CONCAT44(local_4,in_stack_ffffffffffffff90),
                                 in_stack_ffffffffffffff88,(sunindextype)in_stack_ffffffffffffff80,
                                 (sunindextype)(in_stack_ffffffffffffffc0 + 0x13),(N_Vector)0x18776b
                                 ,v), iVar1 != 0)) {
          if ((in_stack_ffffffffffffffc0[0x15] != 0) && ((int)in_stack_ffffffffffffffc0[0x16] != 0))
          {
            iVar1 = SUNNonlinSolFree(in_stack_ffffffffffffffc0[0x15]);
            if (iVar1 != 0) {
              return iVar1;
            }
            in_stack_ffffffffffffffc0[0x15] = 0;
            *(undefined4 *)(in_stack_ffffffffffffffc0 + 0x16) = 0;
            in_stack_ffffffffffffffb8 =
                 (MRIStepInnerStepper)
                 SUNNonlinSol_Newton((N_Vector)(ulong)in_stack_ffffffffffffff90,
                                     (SUNContext_conflict)in_stack_ffffffffffffff88);
            if (in_stack_ffffffffffffffb8 == (MRIStepInnerStepper)0x0) {
              arkProcessError(in_RDI,-0x14,0x1e5,"mriStep_Resize",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                              ,"Error creating default Newton solver");
              return -0x14;
            }
            iVar1 = ARKodeSetNonlinearSolver
                              (in_stack_ffffffffffffff88,
                               (SUNNonlinearSolver)in_stack_ffffffffffffff80);
            if (iVar1 != 0) {
              arkProcessError(in_RDI,-0x14,0x1ee,"mriStep_Resize",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                              ,"Error attaching default Newton solver");
              return -0x14;
            }
            *(undefined4 *)(in_stack_ffffffffffffffc0 + 0x16) = 1;
            local_4 = 0;
          }
          iVar1 = mriStepInnerStepper_Resize
                            (in_stack_ffffffffffffffb8,(ARKVecResizeFn)v,resize_00,
                             (sunindextype)resize_data_00,(sunindextype)pAVar2,
                             (N_Vector)CONCAT44(local_4,in_stack_ffffffffffffff90));
          if (iVar1 == 0) {
            if (in_stack_ffffffffffffffc0[0x15] != 0) {
              in_stack_ffffffffffffffc0[0x35] = 0;
            }
            local_4 = 0;
          }
          else {
            arkProcessError(in_RDI,-0x14,0x1fa,"mriStep_Resize",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                            ,"Unable to resize vector");
            local_4 = -0x14;
          }
        }
        else {
          arkProcessError(in_RDI,-0x14,0x1d1,"mriStep_Resize",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                          ,"Unable to resize vector");
          local_4 = -0x14;
        }
      }
      else {
        arkProcessError(in_RDI,-0x14,0x1c7,"mriStep_Resize",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                        ,"Unable to resize vector");
        local_4 = -0x14;
      }
    }
    else {
      arkProcessError(in_RDI,-0x14,0x1bd,"mriStep_Resize",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                      ,"Unable to resize vector");
      local_4 = -0x14;
    }
  }
  return local_4;
}

Assistant:

int mriStep_Resize(ARKodeMem ark_mem, N_Vector y0,
                   SUNDIALS_MAYBE_UNUSED sunrealtype hscale,
                   SUNDIALS_MAYBE_UNUSED sunrealtype t0, ARKVecResizeFn resize,
                   void* resize_data)
{
  ARKodeMRIStepMem step_mem;
  SUNNonlinearSolver NLS;
  sunindextype lrw1, liw1, lrw_diff, liw_diff;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Determine change in vector sizes */
  lrw1 = liw1 = 0;
  if (y0->ops->nvspace != NULL) { N_VSpace(y0, &lrw1, &liw1); }
  lrw_diff      = lrw1 - ark_mem->lrw1;
  liw_diff      = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;

  /* Resize Fse */
  if (step_mem->Fse)
  {
    if (!arkResizeVecArray(resize, resize_data, step_mem->nstages_allocated, y0,
                           &(step_mem->Fse), lrw_diff, &(ark_mem->lrw),
                           liw_diff, &(ark_mem->liw)))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
    if (step_mem->unify_Fs) { step_mem->Fsi = step_mem->Fse; }
  }

  /* Resize Fsi */
  if (step_mem->Fsi && !step_mem->unify_Fs)
  {
    if (!arkResizeVecArray(resize, resize_data, step_mem->nstages_allocated, y0,
                           &(step_mem->Fsi), lrw_diff, &(ark_mem->lrw),
                           liw_diff, &(ark_mem->liw)))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
  }

  /* Resize the nonlinear solver interface vectors (if applicable) */
  if (step_mem->sdata != NULL)
  {
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                      &step_mem->sdata))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
  }
  if (step_mem->zpred != NULL)
  {
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                      &step_mem->zpred))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
  }
  if (step_mem->zcor != NULL)
  {
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                      &step_mem->zcor))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
  }

  /* If a NLS object was previously used, destroy and recreate default Newton
     NLS object (can be replaced by user-defined object if desired) */
  if ((step_mem->NLS != NULL) && (step_mem->ownNLS))
  {
    /* destroy existing NLS object */
    retval = SUNNonlinSolFree(step_mem->NLS);
    if (retval != ARK_SUCCESS) { return (retval); }
    step_mem->NLS    = NULL;
    step_mem->ownNLS = SUNFALSE;

    /* create new Newton NLS object */
    NLS = SUNNonlinSol_Newton(y0, ark_mem->sunctx);
    if (NLS == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Error creating default Newton solver");
      return (ARK_MEM_FAIL);
    }

    /* attach new Newton NLS object */
    retval = ARKodeSetNonlinearSolver(ark_mem, NLS);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Error attaching default Newton solver");
      return (ARK_MEM_FAIL);
    }
    step_mem->ownNLS = SUNTRUE;
  }

  /* Resize the inner stepper vectors */
  retval = mriStepInnerStepper_Resize(step_mem->stepper, resize, resize_data,
                                      lrw_diff, liw_diff, y0);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    "Unable to resize vector");
    return (ARK_MEM_FAIL);
  }

  /* reset nonlinear solver counters */
  if (step_mem->NLS != NULL) { step_mem->nsetups = 0; }

  return (ARK_SUCCESS);
}